

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int store_script(int pi,char *script)

{
  size_t sVar1;
  gpioExtent_t *in_RSI;
  int in_EDI;
  gpioExtent_t ext [1];
  uint len;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  sVar1 = strlen((char *)in_RSI);
  if ((int)sVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                                 in_stack_ffffffffffffffd8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                 0,in_RSI,in_EDI);
  }
  return local_4;
}

Assistant:

int store_script(int pi, char *script)
{
   unsigned len;
   gpioExtent_t ext[1];

   /*
   p1=0
   p2=0
   p3=len
   ## extension ##
   char[len] script
   */

   len = strlen(script);

   if (!len) return 0;

   ext[0].size = len;
   ext[0].ptr = script;

   return pigpio_command_ext(pi, PI_CMD_PROC, 0, 0, len, 1, ext, 1);
}